

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O1

void HU_DrawColorBar(int x,int y,int height,int playernum)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float b;
  float g;
  float r;
  float v;
  float s;
  float h;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  D_GetPlayerColor(playernum,&local_34,&local_38,&local_3c,(FPlayerColorSet **)0x0);
  HSVtoRGB(&local_40,&local_44,&local_48,local_34,local_38,local_3c);
  iVar2 = (int)(local_40 * 255.0);
  if (0xfe < (int)(local_40 * 255.0)) {
    iVar2 = 0xff;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar3 = (int)(local_44 * 255.0);
  if (0xfe < (int)(local_44 * 255.0)) {
    iVar3 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  uVar1 = 0xff;
  if ((int)(local_48 * 255.0) < 0xff) {
    uVar1 = (int)(local_48 * 255.0);
  }
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
            (screen,(ulong)(uint)x,y,(ulong)(uint)(x + CleanXfac * 0x18),(ulong)(uint)(height + y),
             0xffffffff,iVar3 << 8 | iVar2 << 0x10 | uVar1 | 0xff000000);
  return;
}

Assistant:

void HU_DrawColorBar(int x, int y, int height, int playernum)
{
	float h, s, v, r, g, b;

	D_GetPlayerColor (playernum, &h, &s, &v, NULL);
	HSVtoRGB (&r, &g, &b, h, s, v);

	screen->Clear (x, y, x + 24*CleanXfac, y + height, -1,
		MAKEARGB(255,clamp(int(r*255.f),0,255),
					 clamp(int(g*255.f),0,255),
					 clamp(int(b*255.f),0,255)));
}